

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_cheat.cpp
# Opt level: O0

void cht_Suicide(player_t *plyr)

{
  DSuicider *this;
  APlayerPawn *pointed;
  size_t in_RSI;
  DSuicider *suicide;
  player_t *plyr_local;
  
  if (plyr->mo != (APlayerPawn *)0x0) {
    this = (DSuicider *)DObject::operator_new((DObject *)0x40,in_RSI);
    DSuicider::DSuicider(this);
    TObjPtr<APlayerPawn>::operator=(&this->Pawn,plyr->mo);
    pointed = TObjPtr::operator_cast_to_APlayerPawn_((TObjPtr *)&this->Pawn);
    GC::WriteBarrier((DObject *)this,(DObject *)pointed);
  }
  return;
}

Assistant:

void cht_Suicide (player_t *plyr)
{
	// If this cheat was initiated by the suicide ccmd, and this is a single
	// player game, the CHT_SUICIDE will be processed before the tic is run,
	// so the console has not gone up yet. Use a temporary thinker to delay
	// the suicide until the game ticks so that death noises can be heard on
	// the initial tick.
	if (plyr->mo != NULL)
	{
		DSuicider *suicide = new DSuicider;
		suicide->Pawn = plyr->mo;
		GC::WriteBarrier(suicide, suicide->Pawn);
	}
}